

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O1

Accel * __thiscall embree::BVH4Factory::BVH4QuantizedTriangle4i(BVH4Factory *this,Scene *scene)

{
  BVHN<4> *this_00;
  Builder *pBVar1;
  Accel *pAVar2;
  Intersectors intersectors;
  BVHN<4> *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  Intersector1 local_118 [7];
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&TriangleMi<4>::type,scene);
  pBVar1 = (*this->BVH4QuantizedTriangle4iSceneBuilderSAH)(this_00,scene,0);
  local_118[0].intersect = (IntersectFunc)0x0;
  local_118[0].occluded = (OccludedFunc)0x0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = (BVHN<4> *)0x0;
  uStack_130 = 0;
  memset(&local_118[0].name,0,0xe0);
  local_138 = this_00;
  (*this->QBVH4Triangle4iIntersector1Pluecker)(local_118);
  pAVar2 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar2->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar2->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar2->super_AccelData).field_0x58,&local_138,0x118);
  (pAVar2->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar2[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar2[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar1;
  return pAVar2;
}

Assistant:

Accel* BVH4Factory::BVH4QuantizedTriangle4i(Scene* scene)
  {
    BVH4* accel = new BVH4(Triangle4i::type,scene);
    Builder* builder = BVH4QuantizedTriangle4iSceneBuilderSAH(accel,scene,0);
    Accel::Intersectors intersectors = QBVH4Triangle4iIntersectors(accel);
    return new AccelInstance(accel,builder,intersectors);
  }